

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

_Bool tcg_out_dupm_vec(TCGContext_conflict9 *s,TCGType_conflict type,uint vece,TCGReg r,TCGReg base,
                      intptr_t offset)

{
  int iVar1;
  int vex_l;
  intptr_t offset_local;
  TCGReg base_local;
  TCGReg r_local;
  uint vece_local;
  TCGType_conflict type_local;
  TCGContext_conflict9 *s_local;
  
  if (have_avx2_tricore) {
    iVar1 = 0;
    if (type == TCG_TYPE_V256) {
      iVar1 = 0x80000;
    }
    tcg_out_vex_modrm_offset(s,avx2_dup_insn[vece] + iVar1,r,0,base,offset);
  }
  else {
    switch(vece) {
    case 0:
      tcg_out_vex_modrm_offset(s,0x10420,r,r,base,offset);
      tcg_out8(s,'\0');
      tcg_out_dup_vec(s,type,vece,r,r);
      break;
    case 1:
      tcg_out_vex_modrm_offset(s,0x5c4,r,r,base,offset);
      tcg_out8(s,'\0');
      tcg_out_dup_vec(s,type,vece,r,r);
      break;
    case 2:
      tcg_out_vex_modrm_offset(s,0x618,r,0,base,offset);
      break;
    case 3:
      tcg_out_vex_modrm_offset(s,0x40112,r,0,base,offset);
      break;
    default:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
                 ,0x3b2,(char *)0x0);
    }
  }
  return true;
}

Assistant:

static bool tcg_out_dupm_vec(TCGContext *s, TCGType type, unsigned vece,
                             TCGReg r, TCGReg base, intptr_t offset)
{
    if (have_avx2) {
        int vex_l = (type == TCG_TYPE_V256 ? P_VEXL : 0);
        tcg_out_vex_modrm_offset(s, avx2_dup_insn[vece] + vex_l,
                                 r, 0, base, offset);
    } else {
        switch (vece) {
        case MO_64:
            tcg_out_vex_modrm_offset(s, OPC_MOVDDUP, r, 0, base, offset);
            break;
        case MO_32:
            tcg_out_vex_modrm_offset(s, OPC_VBROADCASTSS, r, 0, base, offset);
            break;
        case MO_16:
            tcg_out_vex_modrm_offset(s, OPC_VPINSRW, r, r, base, offset);
            tcg_out8(s, 0); /* imm8 */
            tcg_out_dup_vec(s, type, vece, r, r);
            break;
        case MO_8:
            tcg_out_vex_modrm_offset(s, OPC_VPINSRB, r, r, base, offset);
            tcg_out8(s, 0); /* imm8 */
            tcg_out_dup_vec(s, type, vece, r, r);
            break;
        default:
            g_assert_not_reached();
        }
    }
    return true;
}